

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  dfa d;
  string local_68;
  _Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_48;
  
  local_48._M_buckets = &local_48._M_single_bucket;
  local_48._M_bucket_count = 1;
  local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48._M_element_count = 0;
  local_48._M_rehash_policy._M_max_load_factor = 1.0;
  local_48._M_rehash_policy._M_next_resize = 0;
  local_48._M_single_bucket = (__node_base_ptr)0x0;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,anon_var_dwarf_209b8,anon_var_dwarf_209b8 + 9);
  dfa::add_word((dfa *)&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,anon_var_dwarf_209db,anon_var_dwarf_209db + 6);
  dfa::add_word((dfa *)&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,anon_var_dwarf_20a11 + 6,anon_var_dwarf_20a11 + 0x15);
  dfa::add_word((dfa *)&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,anon_var_dwarf_20a11 + 0xc,anon_var_dwarf_20a11 + 0x15);
  dfa::add_word((dfa *)&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,anon_var_dwarf_20a11,anon_var_dwarf_20a11 + 0x15);
  dfa::add_content((dfa *)&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::
  _Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_48);
  return 0;
}

Assistant:

int main()
{
    dfa d;

    // 增加敏感词
    d.add_word("中国人");
    d.add_word("人民");
    d.add_word("人民共产党");
    d.add_word("共产党");

    // 增加待分析文本
    d.add_content("中国人民共产党");

    return 0;
}